

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O3

void __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::insert(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         *this,int i,int n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  
  if (0 < n) {
    iVar3 = this->thesize;
    lVar9 = (long)iVar3;
    reSize(this,iVar3 + n);
    if (i < iVar3) {
      lVar8 = lVar9 * 0x3c;
      do {
        lVar9 = lVar9 + -1;
        pNVar4 = this->data;
        *(undefined8 *)((long)pNVar4[(uint)n].val.m_backend.data._M_elems + lVar8 + -0x1c) =
             *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -0x1c);
        puVar1 = (undefined8 *)((long)pNVar4[-1].val.m_backend.data._M_elems + lVar8);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -0x2c);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)pNVar4[(uint)n].val.m_backend.data._M_elems + lVar8 + -0x2c);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)
                 ((long)pNVar4[(ulong)(uint)n - 1].val.m_backend.data._M_elems + lVar8);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        *(undefined4 *)((long)pNVar4[(uint)n].val.m_backend.data._M_elems + lVar8 + -0x14) =
             *(undefined4 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -0x14);
        *(undefined1 *)((long)pNVar4[(uint)n].val.m_backend.data._M_elems + lVar8 + -0x10) =
             *(undefined1 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -0x10);
        *(undefined8 *)((long)pNVar4[(uint)n].val.m_backend.data._M_elems + lVar8 + -0xc) =
             *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -0xc);
        *(undefined4 *)((long)pNVar4[(uint)n].val.m_backend.data._M_elems + lVar8 + -4) =
             *(undefined4 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -4);
        lVar8 = lVar8 + -0x3c;
      } while (i < lVar9);
    }
  }
  return;
}

Assistant:

void insert(int i, int n)
   {
      assert(n >= 0);
      assert(i >= 0);
      assert(i <= thesize);

      if(n > 0)
      {
         int j = thesize;

         reSize(thesize + n);
         assert(thesize == j + n);

         /// move \p n elements in memory from insert position \p i to the back
         while(j > i)
         {
            j--;
            data[j + n] = data[j];
         }
      }
   }